

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O1

bool __thiscall
test_suite::detail::runner::maybe_fail<bool>
          (runner *this,bool cond,char *expr,char *file,int line,char *func,char *msg)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,cond) == 0) {
    (*this->_vptr_runner[6])(this,expr,file,line,func);
    if (msg != (char *)0x0) {
      (*this->_vptr_runner[4])(this,msg);
    }
  }
  else {
    (*this->_vptr_runner[5])(this,expr,file,line,func);
  }
  return cond;
}

Assistant:

bool
  maybe_fail(
      Bool cond,
      char const* expr,
      char const* file,
      int line,
      char const* func,
      char const* msg = nullptr)
  {
    if(!!cond)
    {
      pass(expr, file, line, func);
      return true;
    }
    fail(expr, file, line, func);
    if(msg)
      note(msg);
    return false;
  }